

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int accessPayload(BtCursor *pCur,u32 offset,u32 amt,uchar *pBuf,int eOp)

{
  ushort uVar1;
  uint uVar2;
  MemPage *pPage;
  u8 *puVar3;
  ulong uVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  Pgno *pPVar8;
  u32 uVar9;
  undefined8 uVar10;
  uint uVar11;
  uchar *puVar12;
  uchar *puVar13;
  uchar *puVar14;
  BtShared *pBVar15;
  undefined4 in_register_00000084;
  ulong uVar16;
  long lVar17;
  Pgno nextPage;
  DbPage *pDbPage;
  uint local_64;
  size_t local_60;
  BtShared *local_58;
  uint local_4c;
  ulong local_48;
  uchar *local_40;
  PgHdr *local_38;
  
  local_48 = CONCAT44(in_register_00000084,eOp);
  pPage = pCur->apPage[pCur->iPage];
  local_58 = pCur->pBt;
  if ((pCur->info).nSize == 0) {
    btreeParseCellPtr(pPage,pPage->aData +
                            (CONCAT11(pPage->aCellIdx[(ulong)pCur->aiIdx[pCur->iPage] * 2],
                                      pPage->aCellIdx[(ulong)pCur->aiIdx[pCur->iPage] * 2 + 1]) &
                            pPage->maskPage),&pCur->info);
    pCur->curFlags = pCur->curFlags | 2;
  }
  puVar3 = (pCur->info).pPayload;
  uVar1 = (pCur->info).nLocal;
  uVar10 = 0xdf72;
  if (puVar3 + uVar1 <= pPage->aData + local_58->usableSize) {
    uVar11 = (uint)uVar1;
    if (uVar11 < offset || uVar11 - offset == 0) {
      uVar11 = offset - uVar11;
      iVar7 = 0;
      local_40 = pBuf;
    }
    else {
      uVar9 = uVar11 - offset;
      if (amt + offset <= (uint)uVar1) {
        uVar9 = amt;
      }
      local_60 = (size_t)(int)uVar9;
      puVar13 = puVar3 + offset;
      puVar14 = pBuf;
      if (((local_48 & 1) == 0) ||
         (iVar7 = sqlite3PagerWrite(pPage->pDbPage), puVar13 = pBuf, puVar14 = puVar3 + offset,
         iVar7 == 0)) {
        memcpy(puVar14,puVar13,local_60);
        iVar7 = 0;
      }
      local_40 = pBuf + local_60;
      amt = amt - (int)local_60;
      uVar11 = 0;
    }
    if ((iVar7 == 0) && (amt != 0)) {
      uVar6 = local_58->usableSize - 4;
      uVar16 = (ulong)uVar6;
      uVar1 = (pCur->info).nLocal;
      uVar2 = *(uint *)(puVar3 + uVar1);
      local_64 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      local_60 = CONCAT44(local_60._4_4_,uVar6);
      iVar7 = 0;
      if (((int)local_48 != 2) && (iVar7 = 0, (pCur->curFlags & 4) == 0)) {
        iVar7 = 0;
        uVar6 = (((local_58->usableSize - (uint)uVar1) + (pCur->info).nPayload) - 5) / uVar6;
        bVar5 = true;
        if (pCur->nOvflAlloc < (int)uVar6) {
          local_4c = uVar6 * 2;
          pPVar8 = (Pgno *)sqlite3Realloc(pCur->aOverflow,(long)(int)local_4c << 2);
          iVar7 = 0;
          if (pPVar8 == (Pgno *)0x0) {
            iVar7 = 7;
          }
          else {
            pCur->nOvflAlloc = local_4c;
            pCur->aOverflow = pPVar8;
          }
          bVar5 = pPVar8 != (Pgno *)0x0;
          uVar16 = local_60 & 0xffffffff;
        }
        if (bVar5) {
          memset(pCur->aOverflow,0,(long)(int)uVar6 << 2);
          uVar16 = local_60 & 0xffffffff;
          pCur->curFlags = pCur->curFlags | 4;
        }
      }
      if ((pCur->curFlags & 4) == 0) {
        lVar17 = 0;
      }
      else {
        uVar4 = uVar11 / uVar16;
        lVar17 = 0;
        if (pCur->aOverflow[uVar4] != 0) {
          lVar17 = (long)(int)uVar4;
          local_64 = pCur->aOverflow[lVar17];
          uVar11 = (uint)((ulong)uVar11 % uVar16);
        }
      }
      if (local_64 != 0 && iVar7 == 0) {
        uVar6 = (uint)local_48 & 1;
        local_48 = (ulong)uVar6;
        local_4c = uVar6 * 2 ^ 2;
        lVar17 = lVar17 << 2;
        pBVar15 = local_58;
        do {
          if ((pCur->curFlags & 4) != 0) {
            *(uint *)((long)pCur->aOverflow + lVar17) = local_64;
          }
          uVar6 = (uint)uVar16;
          if (uVar11 < uVar6) {
            uVar9 = uVar6 - uVar11;
            if (amt + uVar11 <= uVar6) {
              uVar9 = amt;
            }
            iVar7 = sqlite3PagerAcquire(pBVar15->pPager,local_64,&local_38,local_4c);
            if (iVar7 == 0) {
              puVar12 = (uchar *)((ulong)(uVar11 + 4) + (long)local_38->pData);
              uVar11 = *local_38->pData;
              local_64 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                         uVar11 << 0x18;
              puVar13 = puVar12;
              puVar14 = local_40;
              if (((int)local_48 == 0) ||
                 (iVar7 = sqlite3PagerWrite(local_38), puVar13 = local_40, puVar14 = puVar12,
                 iVar7 == 0)) {
                memcpy(puVar14,puVar13,(long)(int)uVar9);
                iVar7 = 0;
              }
              uVar11 = 0;
              if (local_38 != (DbPage *)0x0) {
                sqlite3PagerUnrefNotNull(local_38);
              }
            }
            uVar16 = local_60 & 0xffffffff;
            amt = amt - uVar9;
            local_40 = local_40 + (int)uVar9;
            pBVar15 = local_58;
          }
          else {
            uVar2 = *(uint *)((long)pCur->aOverflow + lVar17 + 4);
            if (uVar2 == 0) {
              iVar7 = getOverflowPage(local_58,local_64,(MemPage **)0x0,&local_64);
              uVar16 = local_60 & 0xffffffff;
              pBVar15 = local_58;
              uVar11 = uVar11 - uVar6;
            }
            else {
              iVar7 = 0;
              uVar11 = uVar11 - uVar6;
              local_64 = uVar2;
            }
          }
        } while (((iVar7 == 0) && (amt != 0)) && (lVar17 = lVar17 + 4, local_64 != 0));
      }
    }
    if (iVar7 != 0) {
      return iVar7;
    }
    uVar10 = 0xe00d;
    if (amt == 0) {
      return 0;
    }
  }
  sqlite3_log(0xb,"database corruption at line %d of [%.10s]",uVar10,
              "8a8ffc862e96f57aa698f93de10dee28e69f6e09");
  return 0xb;
}

Assistant:

static int accessPayload(
  BtCursor *pCur,      /* Cursor pointing to entry to read from */
  u32 offset,          /* Begin reading this far into payload */
  u32 amt,             /* Read this many bytes */
  unsigned char *pBuf, /* Write the bytes into this buffer */ 
  int eOp              /* zero to read. non-zero to write. */
){
  unsigned char *aPayload;
  int rc = SQLITE_OK;
  int iIdx = 0;
  MemPage *pPage = pCur->apPage[pCur->iPage]; /* Btree page of current entry */
  BtShared *pBt = pCur->pBt;                  /* Btree this cursor belongs to */
#ifdef SQLITE_DIRECT_OVERFLOW_READ
  unsigned char * const pBufStart = pBuf;
  int bEnd;                                 /* True if reading to end of data */
#endif

  assert( pPage );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->aiIdx[pCur->iPage]<pPage->nCell );
  assert( cursorHoldsMutex(pCur) );
  assert( eOp!=2 || offset==0 );    /* Always start from beginning for eOp==2 */

  getCellInfo(pCur);
  aPayload = pCur->info.pPayload;
#ifdef SQLITE_DIRECT_OVERFLOW_READ
  bEnd = offset+amt==pCur->info.nPayload;
#endif
  assert( offset+amt <= pCur->info.nPayload );

  if( &aPayload[pCur->info.nLocal] > &pPage->aData[pBt->usableSize] ){
    /* Trying to read or write past the end of the data is an error */
    return SQLITE_CORRUPT_BKPT;
  }

  /* Check if data must be read/written to/from the btree page itself. */
  if( offset<pCur->info.nLocal ){
    int a = amt;
    if( a+offset>pCur->info.nLocal ){
      a = pCur->info.nLocal - offset;
    }
    rc = copyPayload(&aPayload[offset], pBuf, a, (eOp & 0x01), pPage->pDbPage);
    offset = 0;
    pBuf += a;
    amt -= a;
  }else{
    offset -= pCur->info.nLocal;
  }


  if( rc==SQLITE_OK && amt>0 ){
    const u32 ovflSize = pBt->usableSize - 4;  /* Bytes content per ovfl page */
    Pgno nextPage;

    nextPage = get4byte(&aPayload[pCur->info.nLocal]);

    /* If the BtCursor.aOverflow[] has not been allocated, allocate it now.
    ** Except, do not allocate aOverflow[] for eOp==2.
    **
    ** The aOverflow[] array is sized at one entry for each overflow page
    ** in the overflow chain. The page number of the first overflow page is
    ** stored in aOverflow[0], etc. A value of 0 in the aOverflow[] array
    ** means "not yet known" (the cache is lazily populated).
    */
    if( eOp!=2 && (pCur->curFlags & BTCF_ValidOvfl)==0 ){
      int nOvfl = (pCur->info.nPayload-pCur->info.nLocal+ovflSize-1)/ovflSize;
      if( nOvfl>pCur->nOvflAlloc ){
        Pgno *aNew = (Pgno*)sqlite3Realloc(
            pCur->aOverflow, nOvfl*2*sizeof(Pgno)
        );
        if( aNew==0 ){
          rc = SQLITE_NOMEM;
        }else{
          pCur->nOvflAlloc = nOvfl*2;
          pCur->aOverflow = aNew;
        }
      }
      if( rc==SQLITE_OK ){
        memset(pCur->aOverflow, 0, nOvfl*sizeof(Pgno));
        pCur->curFlags |= BTCF_ValidOvfl;
      }
    }

    /* If the overflow page-list cache has been allocated and the
    ** entry for the first required overflow page is valid, skip
    ** directly to it.
    */
    if( (pCur->curFlags & BTCF_ValidOvfl)!=0
     && pCur->aOverflow[offset/ovflSize]
    ){
      iIdx = (offset/ovflSize);
      nextPage = pCur->aOverflow[iIdx];
      offset = (offset%ovflSize);
    }

    for( ; rc==SQLITE_OK && amt>0 && nextPage; iIdx++){

      /* If required, populate the overflow page-list cache. */
      if( (pCur->curFlags & BTCF_ValidOvfl)!=0 ){
        assert(!pCur->aOverflow[iIdx] || pCur->aOverflow[iIdx]==nextPage);
        pCur->aOverflow[iIdx] = nextPage;
      }

      if( offset>=ovflSize ){
        /* The only reason to read this page is to obtain the page
        ** number for the next page in the overflow chain. The page
        ** data is not required. So first try to lookup the overflow
        ** page-list cache, if any, then fall back to the getOverflowPage()
        ** function.
        **
        ** Note that the aOverflow[] array must be allocated because eOp!=2
        ** here.  If eOp==2, then offset==0 and this branch is never taken.
        */
        assert( eOp!=2 );
        assert( pCur->curFlags & BTCF_ValidOvfl );
        assert( pCur->pBtree->db==pBt->db );
        if( pCur->aOverflow[iIdx+1] ){
          nextPage = pCur->aOverflow[iIdx+1];
        }else{
          rc = getOverflowPage(pBt, nextPage, 0, &nextPage);
        }
        offset -= ovflSize;
      }else{
        /* Need to read this page properly. It contains some of the
        ** range of data that is being read (eOp==0) or written (eOp!=0).
        */
#ifdef SQLITE_DIRECT_OVERFLOW_READ
        sqlite3_file *fd;
#endif
        int a = amt;
        if( a + offset > ovflSize ){
          a = ovflSize - offset;
        }

#ifdef SQLITE_DIRECT_OVERFLOW_READ
        /* If all the following are true:
        **
        **   1) this is a read operation, and 
        **   2) data is required from the start of this overflow page, and
        **   3) the database is file-backed, and
        **   4) there is no open write-transaction, and
        **   5) the database is not a WAL database,
        **   6) all data from the page is being read.
        **   7) at least 4 bytes have already been read into the output buffer 
        **
        ** then data can be read directly from the database file into the
        ** output buffer, bypassing the page-cache altogether. This speeds
        ** up loading large records that span many overflow pages.
        */
        if( (eOp&0x01)==0                                      /* (1) */
         && offset==0                                          /* (2) */
         && (bEnd || a==ovflSize)                              /* (6) */
         && pBt->inTransaction==TRANS_READ                     /* (4) */
         && (fd = sqlite3PagerFile(pBt->pPager))->pMethods     /* (3) */
         && pBt->pPage1->aData[19]==0x01                       /* (5) */
         && &pBuf[-4]>=pBufStart                               /* (7) */
        ){
          u8 aSave[4];
          u8 *aWrite = &pBuf[-4];
          assert( aWrite>=pBufStart );                         /* hence (7) */
          memcpy(aSave, aWrite, 4);
          rc = sqlite3OsRead(fd, aWrite, a+4, (i64)pBt->pageSize*(nextPage-1));
          nextPage = get4byte(aWrite);
          memcpy(aWrite, aSave, 4);
        }else
#endif

        {
          DbPage *pDbPage;
          rc = sqlite3PagerAcquire(pBt->pPager, nextPage, &pDbPage,
              ((eOp&0x01)==0 ? PAGER_GET_READONLY : 0)
          );
          if( rc==SQLITE_OK ){
            aPayload = sqlite3PagerGetData(pDbPage);
            nextPage = get4byte(aPayload);
            rc = copyPayload(&aPayload[offset+4], pBuf, a, (eOp&0x01), pDbPage);
            sqlite3PagerUnref(pDbPage);
            offset = 0;
          }
        }
        amt -= a;
        pBuf += a;
      }
    }
  }

  if( rc==SQLITE_OK && amt>0 ){
    return SQLITE_CORRUPT_BKPT;
  }
  return rc;
}